

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase754::run(TestCase754 *this)

{
  ReadableFile *pRVar1;
  long *plVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  Own<kj::Directory> OVar7;
  StringPtr text;
  Own<const_kj::File> file;
  Own<kj::Directory> dir;
  TestClock clock;
  undefined8 *local_68;
  ReadableFile *local_60;
  undefined8 *local_58;
  long *local_50;
  String local_48;
  Clock local_28;
  undefined8 local_20;
  
  local_28._vptr_Clock = (_func_int **)&PTR_now_004592c0;
  local_20 = 1000000000;
  OVar7 = newInMemoryDirectory((kj *)&local_58,&local_28);
  (**(code **)(*local_50 + 0x78))(&local_68,local_50,OVar7.ptr);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_60,text);
  ReadableFile::readAllText(&local_48,local_60);
  sVar4 = local_48.content.size_;
  bVar6 = true;
  if (local_48.content.size_ == 7) {
    iVar5 = bcmp(local_48.content.ptr,"foobar",6);
    bVar6 = iVar5 != 0;
  }
  pcVar3 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  if ((bool)(bVar6 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2f8,ERROR,"\"failed: expected \" \"file->readAllText() == \\\"foobar\\\"\"",
               (char (*) [49])"failed: expected file->readAllText() == \"foobar\"");
  }
  (**(code **)(*local_50 + 0x30))(&local_48);
  sVar4 = local_48.content.size_;
  pcVar3 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar3,0x18,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((sVar4 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2f9,ERROR,"\"failed: expected \" \"dir->listNames() == nullptr\"",
               (char (*) [45])"failed: expected dir->listNames() == nullptr");
  }
  pRVar1 = local_60;
  if (local_60 != (ReadableFile *)0x0) {
    local_60 = (ReadableFile *)0x0;
    (**(code **)*local_68)
              (local_68,(pRVar1->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar1->super_FsNode);
  }
  plVar2 = local_50;
  if (local_50 != (long *)0x0) {
    local_50 = (long *)0x0;
    (**(code **)*local_58)(local_58,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }